

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O2

void __thiscall
agge::tests::QuadraticBezierCurveTests::
QBezierIteratorProducesExpectedVerticesAccordinglyToParameters(QuadraticBezierCurveTests *this)

{
  int iVar1;
  allocator local_269;
  undefined1 local_268 [32];
  int local_248;
  point local_244;
  point local_238;
  point local_22c;
  undefined1 local_218 [24];
  point local_200;
  point local_1f4;
  point local_1e8;
  point local_1dc;
  point local_1c8;
  undefined8 local_1bc;
  int local_1b4;
  undefined8 local_1b0;
  int local_1a8;
  undefined8 local_1a4;
  int local_19c;
  undefined8 local_198;
  int local_190;
  undefined8 local_18c;
  int local_184;
  undefined8 local_180;
  int local_178;
  undefined8 local_174;
  int local_16c;
  undefined8 local_168;
  int local_160;
  undefined8 local_15c;
  int local_154;
  undefined8 local_150;
  int local_148;
  undefined8 local_144;
  undefined4 local_13c;
  point local_138;
  point local_12c;
  point local_120;
  point local_114;
  point local_108;
  point local_fc;
  point local_f0;
  point local_e4;
  point local_d8;
  point local_cc;
  point local_c0;
  point local_b4;
  string local_a0;
  LocationInfo local_80;
  qbezier b2;
  qbezier b1;
  
  qbezier::qbezier(&b1,-3.5,7.4,1.0,2.0,10.1,3.8,0.111);
  local_138 = vertex<agge::qbezier>(&b1);
  local_12c = vertex<agge::qbezier>(&b1);
  local_120 = vertex<agge::qbezier>(&b1);
  local_114 = vertex<agge::qbezier>(&b1);
  local_108 = vertex<agge::qbezier>(&b1);
  local_fc = vertex<agge::qbezier>(&b1);
  local_f0 = vertex<agge::qbezier>(&b1);
  local_e4 = vertex<agge::qbezier>(&b1);
  local_d8 = vertex<agge::qbezier>(&b1);
  local_cc = vertex<agge::qbezier>(&b1);
  local_c0 = vertex<agge::qbezier>(&b1);
  local_b4 = vertex<agge::qbezier>(&b1);
  local_1c8.x = -3.5;
  local_1c8.y = 7.4;
  local_1c8.command = 1;
  local_1bc = 0x40c946f3c01c6fcc;
  iVar1 = 2;
  local_1b0 = 0x40ab6e8dbfa33cd2;
  local_1a4 = 0x409343973be84e00;
  local_198 = 0x4080c6133fb38fcc;
  local_18c = 0x4067ec03403a5cd2;
  local_180 = 0x4059a6c240911975;
  local_174 = 0x4056bc6540c8a51a;
  local_168 = 0x405f2ceb4101e8aa;
  local_15c = 0x4072f85641214f13;
  local_150 = 0x407333334121999a;
  local_144 = 0;
  local_13c = 0;
  local_1b4 = iVar1;
  local_1a8 = iVar1;
  local_19c = iVar1;
  local_190 = iVar1;
  local_184 = iVar1;
  local_178 = iVar1;
  local_16c = iVar1;
  local_160 = iVar1;
  local_154 = iVar1;
  local_148 = iVar1;
  std::__cxx11::string::string
            ((string *)local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,(allocator *)&local_80);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_218,(string *)local_268,0x73);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,12ul>
            ((point (*) [12])&local_1c8,(point (*) [12])&local_138,(LocationInfo *)local_218);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  qbezier::qbezier(&b2,1.0,1.0,0.0,0.0,-1.0,1.0,0.3);
  local_218._0_12_ = (undefined1  [12])vertex<agge::qbezier>(&b2);
  local_218._12_12_ = (undefined1  [12])vertex<agge::qbezier>(&b2);
  local_200 = vertex<agge::qbezier>(&b2);
  local_1f4 = vertex<agge::qbezier>(&b2);
  local_1e8 = vertex<agge::qbezier>(&b2);
  local_1dc = vertex<agge::qbezier>(&b2);
  local_268._0_8_ = (pointer)0x3f8000003f800000;
  local_268._8_4_ = 1;
  local_268._12_4_ = 0.39999998;
  local_268._16_4_ = 0.58;
  local_268._24_8_ = 0x3f051eb8be4ccccf;
  local_244.x = -0.8000001;
  local_244.y = 0.82000005;
  local_238.x = -1.0;
  local_238.y = 1.0;
  local_22c.x = 0.0;
  local_22c.y = 0.0;
  local_22c.command = 0;
  local_268._20_4_ = iVar1;
  local_248 = iVar1;
  local_244.command = iVar1;
  local_238.command = iVar1;
  std::__cxx11::string::string
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_269);
  ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x87);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_268,(point (*) [6])local_218,&local_80);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( QBezierIteratorProducesExpectedVerticesAccordinglyToParameters )
			{
				// INIT
				qbezier b1(-3.5f, 7.4f, 1.0f, 2.0f, 10.1f, 3.8f, 0.111f);

				// ACT
				mocks::path::point points1[] = {
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1), vertex(b1), vertex(b1), vertex(b1),
					vertex(b1), vertex(b1),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(-3.50000000f, 7.40000010f),
					lineto(-2.44432354f, 6.28991079f),
					lineto(-1.27529359f, 5.35724497f),
					lineto(0.00708937645f, 4.60200071f),
					lineto(1.40282583f, 4.02417898f),
					lineto(2.91191530f, 3.62378001f),
					lineto(4.53435755f, 3.40080309f),
					lineto(6.27015400f, 3.35524869f),
					lineto(8.11930275f, 3.48711658f),
					lineto(10.0818052f, 3.79640722f),
					lineto(10.1000004f, 3.79999995f),
					stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(1.0f, 1.0f, 0.0f, 0.0f, -1.0f, 1.0f, 0.3f);

				// ACT
				mocks::path::point points2[] = {
					vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2), vertex(b2),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.00000000f, 1.00000000f),
					lineto(0.399999976f, 0.579999983f),
					lineto(-0.200000033f, 0.519999981f),
					lineto(-0.800000072f, 0.820000052f),
					lineto(-1.00000000f, 1.00000000f),
					stop(),
				};

				assert_equal(reference2, points2);
			}